

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void selector(item *x)

{
  item *x_00;
  typeDesc *ptVar1;
  int local_2c;
  int indLev;
  item *y;
  typeDesc *type;
  object *obj;
  item *x_local;
  
  type = (typeDesc *)0x0;
  local_2c = 0;
  x_00 = (item *)calloc(1,0x30);
  while( true ) {
    while( true ) {
      if (currentSymbol != 0x130 && currentSymbol != 0xcd) {
        return;
      }
      if (currentSymbol != 0x130) break;
      getSymbol();
      simpleExpression(x_00);
      ptVar1 = getType(x->typeIndex);
      if (ptVar1->form != 0x322) {
        mark("not an array");
        exit(-1);
      }
      idx(x,x_00);
      if (currentSymbol != 0x12f) {
        mark("missing right bracket");
        exit(-1);
      }
      getSymbol();
    }
    getSymbol();
    if (currentSymbol != 0x1f5) {
      mark("missing identifier");
      exit(-1);
    }
    ptVar1 = getType(x->typeIndex);
    if (ptVar1->base->form == 0x323) {
      type = (typeDesc *)findField(ptVar1->base->fields);
      getSymbol();
    }
    if ((object *)type == guard) break;
    emitField(x,(object *)type,local_2c);
    local_2c = local_2c + 1;
  }
  mark("field undef");
  exit(-1);
}

Assistant:

procedure
void selector(struct item *x) {
	variable struct object *obj;
	variable struct typeDesc *type;
	variable struct item *y;
	variable int indLev; 
	y = NULL; type = NULL; obj = NULL; indLev = 0;
	allocMem(y);
	while ((currentSymbol == SYMBOL_LBRAK) || (currentSymbol == SYMBOL_ARROW)) {
		
		/* deal with array access */
		if (currentSymbol == SYMBOL_LBRAK) {
			getSymbol();
			simpleExpression(y);
			type = getType(x->typeIndex);
			if (type->form == FORM_ARRAY) {
				idx(x,y);
			} else {
				mark("not an array");
				exit(-1);
			}
			if (currentSymbol == SYMBOL_RBRAK) {
				getSymbol();
			} else {
				mark("missing right bracket");
				exit(-1);
			}
		
		/* deal with record access */
		} else { 
			getSymbol();
			if (currentSymbol == SYMBOL_IDENTIFIER) {
				type = getType(x->typeIndex);
				if (type->base->form == FORM_RECORD) {
					obj = findField(type->base->fields);
					getSymbol();
				}
				if (obj != guard) {
					emitField(x,obj,indLev);
				} else {
					mark("field undef");
					exit(-1);
				}
			} else {
				mark("missing identifier");
				exit(-1);
			}
			indLev = indLev + 1;
		}
	}
}